

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

QMetaMethod QMetaMethod::fromSignalImpl(QMetaObject *metaObject,void **signal)

{
  QMetaObject *in_RSI;
  QMetaObject *in_RDI;
  long in_FS_OFFSET;
  QMetaObject *m;
  int i;
  void *args [2];
  void **in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  Call in_stack_ffffffffffffffb4;
  int local_2c;
  QMetaMethod local_28;
  int *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = -1;
  local_18 = &local_2c;
  do {
    if (in_RDI == (QMetaObject *)0x0) {
      QMetaMethod(&local_28);
LAB_0036327a:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_28;
      }
      __stack_chk_fail();
    }
    QMetaObject::static_metacall
              (in_RDI,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
    ;
    if (-1 < local_2c) {
      local_28 = fromRelativeMethodIndex(in_RSI,(int)((ulong)in_RDI >> 0x20));
      goto LAB_0036327a;
    }
    in_RDI = QMetaObject::SuperData::operator_cast_to_QMetaObject_((SuperData *)in_RDI);
  } while( true );
}

Assistant:

QMetaMethod QMetaMethod::fromSignalImpl(const QMetaObject *metaObject, void **signal)
{
    int i = -1;
    void *args[] = { &i, signal };
    for (const QMetaObject *m = metaObject; m; m = m->d.superdata) {
        m->static_metacall(QMetaObject::IndexOfMethod, 0, args);
        if (i >= 0)
            return QMetaMethod::fromRelativeMethodIndex(m, i);
    }
    return QMetaMethod();
}